

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O2

int musl_getopt_long_only(int argc,char **argv,char *optstring,option *longopts,int *idx)

{
  option *poVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  int l;
  long lVar21;
  char cVar22;
  wchar_t wVar23;
  char *pcVar24;
  bool bVar25;
  ulong local_68;
  wchar_t local_50;
  wchar_t c;
  ulong local_48;
  int *local_40;
  char *local_38;
  
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  iVar4 = musl_optind;
  if (argc <= musl_optind) {
    return -1;
  }
  lVar12 = (long)musl_optind;
  if (argv[lVar12] == (char *)0x0) {
    return -1;
  }
  if ((*optstring != '+') && (*optstring != '-')) {
    lVar9 = 0;
    while( true ) {
      if (argc - lVar12 == lVar9) {
        return -1;
      }
      pcVar15 = argv[lVar12 + lVar9];
      if (pcVar15 == (char *)0x0) {
        return -1;
      }
      if ((*pcVar15 == '-') && (pcVar15[1] != '\0')) break;
      lVar9 = lVar9 + 1;
    }
    musl_optind = (int)lVar9 + musl_optind;
  }
  iVar7 = musl_optind;
  musl_optarg = (char *)0x0;
  if ((((longopts == (option *)0x0) || (pcVar15 = argv[musl_optind], *pcVar15 != '-')) ||
      (bVar5 = pcVar15[1], bVar5 == 0)) || ((bVar5 == 0x2d && (pcVar15[2] == '\0')))) {
    bVar25 = false;
LAB_0011499a:
    if ((musl_optind == 0) || (bVar25)) {
      musl_optreset = 0;
      musl_optpos = 0;
      musl_optind = 1;
    }
    wVar23 = L'\xffffffff';
    if ((argc <= musl_optind) || (pcVar15 = argv[musl_optind], pcVar15 == (char *)0x0))
    goto LAB_00114e5d;
    if (*pcVar15 != '-') {
      if (*optstring == '-') {
        musl_optind = musl_optind + 1;
        wVar23 = L'\x01';
        musl_optarg = pcVar15;
      }
      goto LAB_00114e5d;
    }
    if (pcVar15[1] == '\0') goto LAB_00114e5d;
    if ((pcVar15[1] == '-') && (pcVar15[2] == '\0')) {
      musl_optind = musl_optind + 1;
      goto LAB_00114e5d;
    }
    if (musl_optpos == 0) {
      musl_optpos = 1;
    }
    uVar6 = mbtowc(&c,pcVar15 + (uint)musl_optpos,0x10);
    if ((int)uVar6 < 0) {
      c = L'�';
      uVar6 = 1;
    }
    lVar21 = (long)musl_optind;
    uVar14 = (ulong)(uint)musl_optpos;
    sVar10 = (size_t)uVar6;
    lVar9 = sVar10 + uVar14;
    musl_optpos = (int)lVar9;
    if (argv[lVar21][lVar9] == '\0') {
      musl_optind = musl_optind + 1;
      musl_optpos = 0;
    }
    if ((*optstring == '-') || (*optstring == '+')) {
      optstring = optstring + 1;
    }
    local_50 = L'\0';
    pcVar15 = argv[lVar21] + uVar14;
    uVar14 = 0;
    do {
      uVar6 = mbtowc(&local_50,optstring + (uVar14 & 0xffffffff),0x10);
      uVar16 = 1;
      if (1 < (int)uVar6) {
        uVar16 = (ulong)uVar6;
      }
      uVar14 = uVar16 + (uVar14 & 0xffffffff);
    } while ((uVar6 != 0) && (local_50 != c));
    if (local_50 == c && c != L':') {
      wVar23 = local_50;
      if (optstring[uVar14] != ':') goto LAB_00114e5d;
      musl_optarg = (char *)0x0;
      if (musl_optpos != 0 || optstring[uVar14 + 1] != ':') {
        lVar9 = (long)musl_optind;
        musl_optind = musl_optind + 1;
        musl_optarg = argv[lVar9] + (uint)musl_optpos;
        musl_optpos = 0;
      }
      if (musl_optind <= argc) goto LAB_00114e5d;
      musl_optopt = local_50;
      if (*optstring == ':') goto LAB_00114e1f;
      wVar23 = L'?';
      if (musl_opterr == 0) goto LAB_00114e5d;
      pcVar19 = *argv;
      pcVar24 = ": option requires an argument: ";
      musl_optopt = local_50;
    }
    else {
      musl_optopt = c;
      wVar23 = L'?';
      if ((*optstring == ':') || (musl_opterr == 0)) goto LAB_00114e5d;
      pcVar19 = *argv;
      pcVar24 = ": unrecognized option: ";
    }
  }
  else {
    pcVar19 = pcVar15 + 1;
    cVar2 = optstring[(*optstring - 0x2bU & 0xfd) == 0];
    local_48 = CONCAT44(local_48._4_4_,(uint)bVar5);
    pcVar24 = pcVar15 + 2;
    if (bVar5 != 0x2d) {
      pcVar24 = pcVar19;
    }
    uVar14 = 0;
    iVar11 = 0;
    local_68 = 0;
    pcVar8 = (char *)0x0;
    while( true ) {
      pcVar20 = longopts[uVar14].name;
      pcVar18 = pcVar24;
      local_40 = idx;
      if (pcVar20 == (char *)0x0) break;
      for (; (cVar3 = *pcVar18, cVar3 != '\0' && (cVar3 != '=')); pcVar18 = pcVar18 + 1) {
        cVar22 = *pcVar20;
        if (cVar3 != cVar22) {
          if (cVar3 != '\0') goto LAB_00114990;
          goto LAB_00114977;
        }
        pcVar20 = pcVar20 + 1;
      }
      cVar22 = *pcVar20;
LAB_00114977:
      pcVar8 = pcVar18;
      if (cVar22 == '\0') {
        local_68._0_4_ = (int)uVar14;
        goto LAB_00114ba0;
      }
      iVar11 = iVar11 + 1;
      local_68 = uVar14 & 0xffffffff;
LAB_00114990:
      uVar14 = uVar14 + 1;
    }
    if (iVar11 != 1) {
LAB_00114c21:
      if (bVar5 == 0x2d) {
        musl_optopt = 0;
        if ((cVar2 != ':') && (musl_opterr != 0)) {
          pcVar19 = *argv;
          pcVar24 = ": option is ambiguous: ";
          if (iVar11 == 0) {
            pcVar24 = ": unrecognized option: ";
          }
          sVar10 = strlen(pcVar15 + 2);
          musl_getopt_msg(pcVar19,pcVar24,pcVar15 + 2,sVar10);
        }
        musl_optind = musl_optind + 1;
        wVar23 = L'?';
        goto LAB_00114e5d;
      }
      bVar25 = musl_optreset != 0;
      goto LAB_0011499a;
    }
LAB_00114ba0:
    local_48 = (long)pcVar8 - (long)pcVar19;
    local_38 = pcVar8;
    iVar11 = mblen(pcVar19,0x10);
    if (local_48 == (long)iVar11) {
      lVar9 = 0;
      uVar14 = 0;
      pcVar15 = optstring;
      if (0 < (int)local_48) {
        uVar14 = local_48 & 0xffffffff;
      }
      do {
        if (optstring[lVar9] == '\0') goto LAB_00114c95;
        for (uVar16 = 0;
            (uVar17 = uVar14, uVar14 != uVar16 &&
            (uVar17 = uVar16, pcVar19[uVar16] == pcVar15[uVar16])); uVar16 = uVar16 + 1) {
        }
        lVar9 = lVar9 + 1;
        pcVar15 = pcVar15 + 1;
      } while ((int)uVar17 != (int)local_48);
      pcVar15 = argv[musl_optind];
      bVar5 = pcVar15[1];
      iVar11 = 1;
      goto LAB_00114c21;
    }
LAB_00114c95:
    iVar11 = musl_optind + 1;
    poVar1 = longopts + (int)local_68;
    if (*local_38 != '=') {
      if (longopts[(int)local_68].has_arg != 1) {
LAB_00114d05:
        musl_optind = iVar11;
        if (local_40 != (int *)0x0) {
          *local_40 = (int)local_68;
        }
        wVar23 = poVar1->val;
        if (poVar1->flag != (wchar_t *)0x0) {
          *poVar1->flag = wVar23;
          wVar23 = L'\0';
        }
        goto LAB_00114e5d;
      }
      musl_optarg = argv[(long)musl_optind + 1];
      if (musl_optarg != (char *)0x0) {
        iVar11 = musl_optind + 2;
        goto LAB_00114d05;
      }
      musl_optopt = poVar1->val;
      musl_optind = iVar11;
      if (cVar2 != ':') {
        wVar23 = L'?';
        if (musl_opterr == 0) goto LAB_00114e5d;
        pcVar19 = *argv;
        pcVar15 = poVar1->name;
        sVar10 = strlen(pcVar15);
        pcVar24 = ": option requires an argument: ";
        goto LAB_00114e58;
      }
LAB_00114e1f:
      wVar23 = L':';
      goto LAB_00114e5d;
    }
    if (longopts[(int)local_68].has_arg != 0) {
      musl_optarg = local_38 + 1;
      goto LAB_00114d05;
    }
    musl_optopt = poVar1->val;
    wVar23 = L'?';
    musl_optind = iVar11;
    if ((cVar2 == ':') || (musl_opterr == 0)) goto LAB_00114e5d;
    pcVar19 = *argv;
    pcVar15 = poVar1->name;
    sVar10 = strlen(pcVar15);
    pcVar24 = ": option does not take an argument: ";
  }
LAB_00114e58:
  musl_getopt_msg(pcVar19,pcVar24,pcVar15,sVar10);
  wVar23 = L'?';
LAB_00114e5d:
  if (iVar4 < iVar7) {
    iVar7 = musl_optind - iVar7;
    iVar11 = 0;
    iVar13 = 0;
    if (0 < iVar7) {
      iVar11 = iVar7;
      iVar13 = 0;
    }
    for (; iVar13 != iVar11; iVar13 = iVar13 + 1) {
      pcVar15 = argv[(long)musl_optind + -1];
      lVar9 = (long)musl_optind;
      while (lVar21 = lVar9 + -1, lVar12 < lVar21) {
        argv[lVar21] = argv[lVar9 + -2];
        lVar9 = lVar21;
      }
      argv[lVar12] = pcVar15;
    }
    musl_optind = iVar7 + iVar4;
  }
  return wVar23;
}

Assistant:

int musl_getopt_long_only(int argc, char **argv, char const *optstring,
			  const struct option *longopts, int *idx)
{
	return musl_getopt_long(argc, argv, optstring, longopts, idx, 1);
}